

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O1

int ddPermuteWindow4(DdManager *table,int w)

{
  int y;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = table->keys - table->isolated;
  iVar3 = w + 1;
  iVar1 = cuddSwapInPlace(table,w,iVar3);
  uVar4 = 1;
  if (iVar1 < iVar5) {
    if (iVar1 == 0) {
      return 0;
    }
    uVar4 = 7;
    iVar5 = iVar1;
  }
  iVar1 = w + 2;
  y = w + 3;
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0xd;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if ((iVar2 < iVar5) || ((8 < uVar4 && (iVar2 == iVar5)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 8;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar3,iVar1);
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0xe;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if ((iVar2 < iVar5) || ((9 < uVar4 && (iVar2 == iVar5)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 9;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0xf;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x14;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar3,iVar1);
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x17;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0x13 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x13;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0x15 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x15;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x18;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar3,iVar1);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0x16 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x16;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0x12 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x12;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0xc < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0xc;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0x11 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x11;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar3,iVar1);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0xb < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0xb;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (0x10 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x10;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (10 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 10;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,w,iVar3);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (5 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 5;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar3,iVar1);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (3 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 3;
    iVar5 = iVar2;
  }
  iVar2 = cuddSwapInPlace(table,iVar1,y);
  if ((iVar2 < iVar5) || ((iVar2 == iVar5 && (6 < uVar4)))) {
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 6;
    iVar5 = iVar2;
  }
  iVar3 = cuddSwapInPlace(table,w,iVar3);
  if ((iVar3 < iVar5) || ((iVar3 == iVar5 && (4 < uVar4)))) {
    if (iVar3 == 0) {
      return 0;
    }
    uVar4 = 4;
    iVar5 = iVar3;
  }
  iVar3 = cuddSwapInPlace(table,iVar1,y);
  if (((iVar3 < iVar5) || ((iVar3 == iVar5 && (2 < uVar4)))) && (uVar4 = 2, iVar3 == 0)) {
    return 0;
  }
  iVar3 = (*(code *)(&DAT_00941208 + *(int *)(&DAT_00941208 + (ulong)(uVar4 - 1) * 4)))();
  return iVar3;
}

Assistant:

static int
ddPermuteWindow4(
  DdManager * table,
  int  w)
{
    int x,y,z;
    int size,sizeNew;
    int best;

#ifdef DD_DEBUG
    assert(table->dead == 0);
    assert(w+3 < table->size);
#endif

    size = table->keys - table->isolated;
    x = w+1; y = x+1; z = y+1;

    /* The permutation pattern is:
     * (w,x)(y,z)(w,x)(x,y)
     * (y,z)(w,x)(y,z)(x,y)
     * repeated three times to get all 4! = 24 permutations.
     * This gives a hamiltonian circuit of Cayley's graph.
     * The codes to the permutation are assigned in topological order.
     * The permutations at lower distance from the final permutation are
     * assigned lower codes. This way we can choose, between
     * permutations that give the same size, one that requires the minimum
     * number of swaps from the final permutation of the hamiltonian circuit.
     * There is an exception to this rule: ABCD is given Code 1, to
     * avoid oscillation when convergence is sought.
     */
#define ABCD 1
    best = ABCD;

#define BACD 7
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = BACD;
        size = sizeNew;
    }
#define BADC 13
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = BADC;
        size = sizeNew;
    }
#define ABDC 8
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size || (sizeNew == size && ABDC < best)) {
        if (sizeNew == 0) return(0);
        best = ABDC;
        size = sizeNew;
    }
#define ADBC 14
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = ADBC;
        size = sizeNew;
    }
#define ADCB 9
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && ADCB < best)) {
        if (sizeNew == 0) return(0);
        best = ADCB;
        size = sizeNew;
    }
#define DACB 15
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = DACB;
        size = sizeNew;
    }
#define DABC 20
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = DABC;
        size = sizeNew;
    }
#define DBAC 23
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = DBAC;
        size = sizeNew;
    }
#define BDAC 19
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size || (sizeNew == size && BDAC < best)) {
        if (sizeNew == 0) return(0);
        best = BDAC;
        size = sizeNew;
    }
#define BDCA 21
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && BDCA < best)) {
        if (sizeNew == 0) return(0);
        best = BDCA;
        size = sizeNew;
    }
#define DBCA 24
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = DBCA;
        size = sizeNew;
    }
#define DCBA 22
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size || (sizeNew == size && DCBA < best)) {
        if (sizeNew == 0) return(0);
        best = DCBA;
        size = sizeNew;
    }
#define DCAB 18
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && DCAB < best)) {
        if (sizeNew == 0) return(0);
        best = DCAB;
        size = sizeNew;
    }
#define CDAB 12
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size || (sizeNew == size && CDAB < best)) {
        if (sizeNew == 0) return(0);
        best = CDAB;
        size = sizeNew;
    }
#define CDBA 17
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && CDBA < best)) {
        if (sizeNew == 0) return(0);
        best = CDBA;
        size = sizeNew;
    }
#define CBDA 11
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size || (sizeNew == size && CBDA < best)) {
        if (sizeNew == 0) return(0);
        best = CBDA;
        size = sizeNew;
    }
#define BCDA 16
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size || (sizeNew == size && BCDA < best)) {
        if (sizeNew == 0) return(0);
        best = BCDA;
        size = sizeNew;
    }
#define BCAD 10
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && BCAD < best)) {
        if (sizeNew == 0) return(0);
        best = BCAD;
        size = sizeNew;
    }
#define CBAD 5
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size || (sizeNew == size && CBAD < best)) {
        if (sizeNew == 0) return(0);
        best = CBAD;
        size = sizeNew;
    }
#define CABD 3
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size || (sizeNew == size && CABD < best)) {
        if (sizeNew == 0) return(0);
        best = CABD;
        size = sizeNew;
    }
#define CADB 6
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && CADB < best)) {
        if (sizeNew == 0) return(0);
        best = CADB;
        size = sizeNew;
    }
#define ACDB 4
    sizeNew = cuddSwapInPlace(table,w,x);
    if (sizeNew < size || (sizeNew == size && ACDB < best)) {
        if (sizeNew == 0) return(0);
        best = ACDB;
        size = sizeNew;
    }
#define ACBD 2
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size || (sizeNew == size && ACBD < best)) {
        if (sizeNew == 0) return(0);
        best = ACBD;
        size = sizeNew;
    }

    /* Now take the shortest route to the best permutation.
    ** The initial permutation is ACBD.
    */
    switch(best) {
    case DBCA: if (!cuddSwapInPlace(table,y,z)) return(0);
    case BDCA: if (!cuddSwapInPlace(table,x,y)) return(0);
    case CDBA: if (!cuddSwapInPlace(table,w,x)) return(0);
    case ADBC: if (!cuddSwapInPlace(table,y,z)) return(0);
    case ABDC: if (!cuddSwapInPlace(table,x,y)) return(0);
    case ACDB: if (!cuddSwapInPlace(table,y,z)) return(0);
    case ACBD: break;
    case DCBA: if (!cuddSwapInPlace(table,y,z)) return(0);
    case BCDA: if (!cuddSwapInPlace(table,x,y)) return(0);
    case CBDA: if (!cuddSwapInPlace(table,w,x)) return(0);
               if (!cuddSwapInPlace(table,x,y)) return(0);
               if (!cuddSwapInPlace(table,y,z)) return(0);
               break;
    case DBAC: if (!cuddSwapInPlace(table,x,y)) return(0);
    case DCAB: if (!cuddSwapInPlace(table,w,x)) return(0);
    case DACB: if (!cuddSwapInPlace(table,y,z)) return(0);
    case BACD: if (!cuddSwapInPlace(table,x,y)) return(0);
    case CABD: if (!cuddSwapInPlace(table,w,x)) return(0);
               break;
    case DABC: if (!cuddSwapInPlace(table,y,z)) return(0);
    case BADC: if (!cuddSwapInPlace(table,x,y)) return(0);
    case CADB: if (!cuddSwapInPlace(table,w,x)) return(0);
               if (!cuddSwapInPlace(table,y,z)) return(0);
               break;
    case BDAC: if (!cuddSwapInPlace(table,x,y)) return(0);
    case CDAB: if (!cuddSwapInPlace(table,w,x)) return(0);
    case ADCB: if (!cuddSwapInPlace(table,y,z)) return(0);
    case ABCD: if (!cuddSwapInPlace(table,x,y)) return(0);
               break;
    case BCAD: if (!cuddSwapInPlace(table,x,y)) return(0);
    case CBAD: if (!cuddSwapInPlace(table,w,x)) return(0);
               if (!cuddSwapInPlace(table,x,y)) return(0);
               break;
    default: return(0);
    }

#ifdef DD_DEBUG
    assert(table->keys - table->isolated == (unsigned) size);
#endif

    return(best);

}